

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  cmCommand *this_00;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  char *pcVar9;
  undefined8 string;
  string e_1;
  string output;
  string input;
  string regex;
  string outvar;
  RegularExpression re;
  string local_1e8;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  cmCommand *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  RegularExpression local_100;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  pcVar2 = pbVar1[3]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.program = (char *)0x0;
  bVar5 = cmsys::RegularExpression::compile(&local_100,local_180._M_dataplus._M_p);
  if (bVar5) {
    local_1c8._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_1c8._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    local_118 = 0;
    local_110 = '\0';
    local_120 = &local_110;
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)&local_1a8,
               (Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_1c8,&local_110);
    if (local_120 != &local_110) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c8[0x10] = '\0';
    paVar7 = &local_1e8.field_2;
    string = local_1a8._M_allocated_capacity;
    local_188 = &this->super_cmCommand;
    while( true ) {
      bVar5 = cmsys::RegularExpression::find(&local_100,(char *)string);
      if (!bVar5) break;
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_100);
      pcVar4 = local_100.searchstring;
      pcVar3 = local_100.endp[0];
      pcVar9 = local_100.startp[0];
      if (local_100.endp[0] == local_100.startp[0]) {
        std::operator+(&local_140,"sub-command REGEX, mode MATCHALL regex \"",&local_180);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
        this_00 = local_188;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1e8.field_2._M_allocated_capacity = *psVar8;
          local_1e8.field_2._8_8_ = plVar6[3];
          local_1e8._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *psVar8;
          local_1e8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1e8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(this_00,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar7) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002812fb;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::append(local_1c8);
      }
      pcVar9 = (char *)(string + ((long)pcVar9 - (long)pcVar4));
      string = string + ((long)pcVar3 - (long)pcVar4);
      local_1e8._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar9,string);
      std::__cxx11::string::_M_append(local_1c8,(ulong)local_1e8._M_dataplus._M_p);
      this = (cmStringCommand *)local_188;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar7) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_160,(char *)local_1c8._0_8_);
LAB_002812fb:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1);
    }
    bVar5 = !bVar5;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   "sub-command REGEX, mode MATCHALL failed to compile regex \"",&local_180);
    plVar6 = (long *)std::__cxx11::string::append(local_1c8);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar7) {
      local_198._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_198._8_8_ = plVar6[3];
      local_1a8._M_allocated_capacity = (size_type)&local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_1a8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_1a8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while(re.find(p))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e = "sub-command REGEX, mode MATCHALL regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    if(!output.empty())
      {
      output += ";";
      }
    output += std::string(p+l, r-l);
    p += r;
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}